

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int parse_escaped_codepoint(xmlRegParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = parse_escaped_codeunit(ctxt);
  if ((uVar2 & 0xfffffc00) == 0xd800) {
    pxVar1 = ctxt->cur;
    ctxt->cur = pxVar1 + 1;
    if (((pxVar1[1] == '\\') && (ctxt->cur = pxVar1 + 2, pxVar1[2] == 'u')) &&
       (uVar3 = parse_escaped_codeunit(ctxt), (uVar3 & 0xfffffc00) == 0xdc00)) {
      return uVar2 * 0x400 + uVar3 + -0x35fdc00;
    }
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Invalid low surrogate pair code unit");
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static int parse_escaped_codepoint(xmlRegParserCtxtPtr ctxt)
{
    int val = parse_escaped_codeunit(ctxt);
    if (0xD800 <= val && val <= 0xDBFF) {
	NEXT;
	if (CUR == '\\') {
	    NEXT;
	    if (CUR == 'u') {
		int low = parse_escaped_codeunit(ctxt);
		if (0xDC00 <= low && low <= 0xDFFF) {
		    return (val - 0xD800) * 0x400 + (low - 0xDC00) + 0x10000;
		}
	    }
	}
	ERROR("Invalid low surrogate pair code unit");
	val = -1;
    }
    return val;
}